

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O0

void duckdb::DateTruncFunction<duckdb::interval_t,duckdb::interval_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  bool bVar2;
  DatePartSpecifier type_00;
  reference this;
  reference result_00;
  Vector *in_RDX;
  DataChunk *in_RDI;
  DatePartSpecifier type;
  value_type *date_arg;
  value_type *part_arg;
  size_type in_stack_ffffffffffffff68;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffff70;
  Vector *in_stack_ffffffffffffff80;
  string_t *in_stack_ffffffffffffffa8;
  string local_50 [8];
  idx_t in_stack_ffffffffffffffb8;
  Vector *in_stack_ffffffffffffffc0;
  Vector *in_stack_ffffffffffffffc8;
  
  this = vector<duckdb::Vector,_true>::operator[]
                   (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  result_00 = vector<duckdb::Vector,_true>::operator[]
                        (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  VVar1 = Vector::GetVectorType(this);
  if (VVar1 == CONSTANT_VECTOR) {
    bVar2 = ConstantVector::IsNull((Vector *)0xbe7318);
    if (bVar2) {
      duckdb::Vector::SetVectorType((VectorType)in_RDX);
      duckdb::ConstantVector::SetNull(in_RDX,true);
    }
    else {
      ConstantVector::GetData<duckdb::string_t>((Vector *)0xbe7351);
      string_t::GetString_abi_cxx11_(in_stack_ffffffffffffffa8);
      type_00 = duckdb::GetDatePartSpecifier(local_50);
      std::__cxx11::string::~string(local_50);
      DataChunk::size(in_RDI);
      DateTruncUnaryExecutor<duckdb::interval_t,duckdb::interval_t>
                (type_00,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffb8);
    }
  }
  else {
    DataChunk::size(in_RDI);
    BinaryExecutor::
    ExecuteStandard<duckdb::string_t,duckdb::interval_t,duckdb::interval_t,duckdb::DateTruncBinaryOperator>
              (in_stack_ffffffffffffff80,in_RDX,result_00,(idx_t)this);
  }
  return;
}

Assistant:

static void DateTruncFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &part_arg = args.data[0];
	auto &date_arg = args.data[1];

	if (part_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		// Common case of constant part.
		if (ConstantVector::IsNull(part_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			const auto type = GetDatePartSpecifier(ConstantVector::GetData<string_t>(part_arg)->GetString());
			DateTruncUnaryExecutor<TA, TR>(type, date_arg, result, args.size());
		}
	} else {
		BinaryExecutor::ExecuteStandard<string_t, TA, TR, DateTruncBinaryOperator>(part_arg, date_arg, result,
		                                                                           args.size());
	}
}